

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O3

void __thiscall BufferedFile::FindByte(BufferedFile *this,byte byte)

{
  __normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> _Var1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pbVar5;
  ulong uVar6;
  pointer pbVar7;
  long in_FS_OFFSET;
  byte local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = this->m_read_pos;
  pbVar7 = (this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
  pbVar5 = (this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = uVar4 % (ulong)((long)pbVar5 - (long)pbVar7);
  local_39 = byte;
  while( true ) {
    uVar2 = this->nSrcPos;
    if (uVar4 == uVar2) {
      Fill(this);
      pbVar5 = (this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pbVar7 = (this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = this->nSrcPos;
      uVar4 = this->m_read_pos;
    }
    pbVar7 = pbVar7 + uVar3;
    uVar6 = (long)pbVar5 - (long)pbVar7;
    if (uVar2 - uVar4 < (ulong)((long)pbVar5 - (long)pbVar7)) {
      uVar6 = uVar2 - uVar4;
    }
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>,__gnu_cxx::__ops::_Iter_equals_val<std::byte_const>>
                      (pbVar7,pbVar7 + uVar6,&local_39);
    uVar2 = (long)_Var1._M_current - (long)pbVar7;
    uVar4 = this->m_read_pos + uVar2;
    this->m_read_pos = uVar4;
    if (uVar2 < uVar6) break;
    uVar3 = uVar2 + uVar3;
    pbVar7 = (this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar5 = (this->vchBuf).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)((long)pbVar5 - (long)pbVar7) <= uVar3) {
      uVar3 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void FindByte(std::byte byte)
    {
        // For best performance, avoid mod operation within the loop.
        size_t buf_offset{size_t(m_read_pos % uint64_t(vchBuf.size()))};
        while (true) {
            if (m_read_pos == nSrcPos) {
                // No more bytes available; read from the file into the buffer,
                // setting nSrcPos to one beyond the end of the new data.
                // Throws exception if end-of-file reached.
                Fill();
            }
            const size_t len{std::min<size_t>(vchBuf.size() - buf_offset, nSrcPos - m_read_pos)};
            const auto it_start{vchBuf.begin() + buf_offset};
            const auto it_find{std::find(it_start, it_start + len, byte)};
            const size_t inc{size_t(std::distance(it_start, it_find))};
            m_read_pos += inc;
            if (inc < len) break;
            buf_offset += inc;
            if (buf_offset >= vchBuf.size()) buf_offset = 0;
        }
    }